

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O2

Code * __thiscall
md::Code::or_to_dx(Code *this,Param *param,DataRegister *reg,Size size,bool param_minus_reg)

{
  uint16_t uVar1;
  int iVar2;
  ushort uVar3;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_38;
  
  uVar3 = 0x40;
  if (size != WORD) {
    uVar3 = (ushort)(size == LONG) << 7;
  }
  iVar2 = (**(reg->super_Register).super_Param._vptr_Param)(reg);
  uVar1 = Param::getMXn(param);
  add_word(this,uVar1 + ((ushort)param_minus_reg << 8 | (ushort)(iVar2 << 9) | uVar3) + 0x8000);
  (*param->_vptr_Param[2])(&_Stack_38,param);
  add_bytes(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_38);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_38);
  return this;
}

Assistant:

Code& Code::or_to_dx(const Param& param, const DataRegister& reg, Size size, bool param_minus_reg)
{
    uint16_t size_code = 0x0;
    if (size == Size::WORD)
        size_code = 0x1;
    else if (size == Size::LONG)
        size_code = 0x2;

    uint16_t param_minus_reg_mask = ((param_minus_reg) ? 1 : 0) << 8;

    uint16_t opcode = 0x8000 + (reg.getXn() << 9) + param_minus_reg_mask + (size_code << 6) + param.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(param.getAdditionnalData());

    return *this;
}